

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O3

void __thiscall FormatTypeRAW::HandleOOB(FormatTypeRAW *this,uchar *buffer,int *pos)

{
  pointer *ppaVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  int iVar5;
  iterator __position;
  ushort uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  char *pcVar10;
  ulong uVar11;
  int size;
  uint uVar12;
  ulong uVar14;
  IndexElement element;
  char buffer_1 [256];
  anon_struct_12_3_f9d4f096 local_144;
  char local_138 [264];
  ulong uVar13;
  
  this->stream_position_ = this->stream_position_ + 1;
  iVar5 = *pos;
  *pos = iVar5 + 1;
  uVar2 = buffer[iVar5];
  *pos = iVar5 + 2;
  uVar3 = buffer[(long)iVar5 + 1];
  *pos = iVar5 + 3;
  uVar4 = buffer[(long)iVar5 + 2];
  this->stream_position_ = this->stream_position_ - 1;
  switch(uVar2) {
  case '\x01':
  case '\x03':
    GetDWFromBuffer(this,buffer,pos);
    GetDWFromBuffer(this,buffer,pos);
    this->stream_position_ = this->stream_position_ - 8;
    break;
  case '\x02':
    uVar7 = GetDWFromBuffer(this,buffer,pos);
    uVar8 = GetDWFromBuffer(this,buffer,pos);
    uVar9 = GetDWFromBuffer(this,buffer,pos);
    uVar12 = this->stream_position_ - 0xc;
    uVar13 = (ulong)uVar12;
    this->stream_position_ = uVar12;
    local_144.index_clock = (uint)uVar9;
    local_144.stream_position = (uint)uVar7;
    local_144.flux_value = (uint)uVar8;
    if (this->last_stream_index_position_ == 0) {
      pcVar10 = "Index %i found at pos : %i - Pos in file : %i - Sample counter : %i";
      uVar11 = uVar7 & 0xffffffff;
      uVar14 = uVar8 & 0xffffffff;
    }
    else {
      uVar11 = (ulong)(local_144.index_clock - this->last_stream_index_count_);
      uVar14 = (ulong)(local_144.stream_position - this->last_stream_index_position_);
      pcVar10 = 
      "Index found at pos : %i - Diff with last : %i - Pos in file : %i - Diff with last : %i - Sample counter : %i"
      ;
      uVar13 = uVar7 & 0xffffffff;
    }
    sprintf(local_138,pcVar10,uVar9 & 0xffffffff,uVar11,uVar13,uVar14);
    this->last_stream_index_position_ = local_144.stream_position;
    this->last_stream_index_count_ = local_144.index_clock;
    __position._M_current =
         (this->index_list_).
         super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->index_list_).
        super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<FormatTypeRAW::IndexElement,std::allocator<FormatTypeRAW::IndexElement>>::
      _M_realloc_insert<FormatTypeRAW::IndexElement_const&>
                ((vector<FormatTypeRAW::IndexElement,std::allocator<FormatTypeRAW::IndexElement>> *)
                 &this->index_list_,__position,&local_144);
    }
    else {
      (__position._M_current)->index_clock = local_144.index_clock;
      (__position._M_current)->flux_value = local_144.flux_value;
      (__position._M_current)->stream_position = local_144.stream_position;
      ppaVar1 = &(this->index_list_).
                 super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    break;
  case '\x04':
    uVar6 = CONCAT11(uVar4,uVar3);
    pcVar10 = (char *)operator_new__((ulong)uVar6);
    iVar5 = *pos;
    strncpy(pcVar10,(char *)(buffer + iVar5),(ulong)uVar6);
    *pos = (uint)uVar6 + iVar5;
    HandleHWInfo(this,pcVar10,size);
    operator_delete__(pcVar10);
    return;
  default:
    if (uVar2 == '\r') {
      this->finished_ = true;
    }
  }
  return;
}

Assistant:

void FormatTypeRAW::HandleOOB(const unsigned char* buffer, int& pos)
{
   char type;
   unsigned short size;

   type = GetFromBuffer(buffer, pos);
   size = GetWFromBuffer(buffer, pos);
   stream_position_ -= 3;

   switch (type)
   {
   case 0x00: // Invalid O_OB
      {
         //      LOG(_T("ERROR : INVALID O_OB !"));
         //      LOGEOL;
         //m_bFinished = true;
         break;
      }
   case 0x01:
      {
         // size should be 8
         // Use it for check ?
         unsigned int stream_pos = GetDWFromBuffer(buffer, pos);
         unsigned int transfert_time = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 8;
         if (stream_position_ != stream_pos)
         {
            int dbg = 1;
         }
         break;
      }

   case 0x02: // Index signal data
      {
         // size should be 0x0C - TOCHECK ?
         unsigned int streamPos = GetDWFromBuffer(buffer, pos);
         unsigned int sampleCounter = GetDWFromBuffer(buffer, pos);
         unsigned int indexCounter = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 12;
         char buffer[256];
         if (last_stream_index_position_ == 0)
         {
            sprintf(buffer, "Index %i found at pos : %i - Pos in file : %i - Sample counter : %i", indexCounter,
                    streamPos, stream_position_, sampleCounter);
         }
         else
         {
            sprintf(buffer,
                    "Index found at pos : %i - Diff with last : %i - Pos in file : %i - Diff with last : %i - Sample counter : %i",
                    indexCounter, indexCounter - last_stream_index_count_, streamPos,
                    streamPos - last_stream_index_position_, sampleCounter);
         }
         last_stream_index_position_ = streamPos;
         last_stream_index_count_ = indexCounter;
         /*LOG(buffer);
         LOGEOL;*/
         IndexElement element;

         element.flux_value = sampleCounter;
         element.index_clock = indexCounter;
         element.stream_position = streamPos;


         index_list_.push_back(element);

         break;
      }

   case 0x03: // No more flux to transfer (one per track)
      {
         // size should be 8 - TOCHECK ?
         unsigned int stream_pos = GetDWFromBuffer(buffer, pos);
         unsigned int result_code = GetDWFromBuffer(buffer, pos);
         stream_position_ -= 8;
         if (stream_position_ != stream_pos)
         {
            /*LOGEOL
            LOG(_T("Stream position error.... "));
            LOGEOL*/
         }
         break;
      }
   case 0x04: // HW Information from KryoFlux device
      {
         char* info = new char[size];

         ReadASCIIFromBuffer(buffer, pos, info, size);
         OutputDebugString(info);
         OutputDebugString("\n");
         // Handle it
         HandleHWInfo(info, size);
         delete[]info;

         break;
      }
   case 0xD: // End of file (no more data to process)
      finished_ = true;
      break;
   default:
      // ERROR !
      break;
   }
}